

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_repeated_message_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::csharp::RepeatedMessageFieldGenerator::WriteToString
          (RepeatedMessageFieldGenerator *this,Printer *printer)

{
  mapped_type *this_00;
  FieldDescriptor *in_RDX;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_01;
  allocator local_59;
  key_type local_58;
  string local_38;
  
  GetFieldName_abi_cxx11_(&local_38,(csharp *)(this->super_FieldGeneratorBase).descriptor_,in_RDX);
  std::__cxx11::string::string((string *)&local_58,"field_name",&local_59);
  this_01 = &(this->super_FieldGeneratorBase).variables_;
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](this_01,&local_58);
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  io::Printer::Print(printer,this_01,"PrintField(\"$field_name$\", $name$_, writer);\n");
  return;
}

Assistant:

void RepeatedMessageFieldGenerator::WriteToString(io::Printer* printer) {
  variables_["field_name"] = GetFieldName(descriptor_);
  printer->Print(
    variables_,
    "PrintField(\"$field_name$\", $name$_, writer);\n");
}